

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet_tests.cpp
# Opt level: O2

void __thiscall wallet::wallet_tests::importwallet_rescan::test_method(importwallet_rescan *this)

{
  unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *val;
  CKey *this_00;
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  *this_01;
  ArgsManager *this_02;
  long lVar1;
  pointer ppCVar2;
  pointer ppCVar3;
  pointer psVar4;
  MockableData records;
  MockableData records_00;
  UniValue val_00;
  UniValue val_01;
  element_type *peVar5;
  Chainstate *pCVar6;
  LegacyScriptPubKeyMan *pLVar7;
  mapped_type *pmVar8;
  CWalletTx *pCVar9;
  size_t i;
  ulong uVar10;
  iterator pvVar11;
  iterator pvVar12;
  bool *pbVar13;
  long lVar14;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  undefined8 in_stack_fffffffffffffa18;
  TestChain100Setup *pTVar15;
  TestChain100Setup *pTVar16;
  undefined8 in_stack_fffffffffffffa28;
  undefined8 in_stack_fffffffffffffa30;
  undefined8 in_stack_fffffffffffffa38;
  size_t in_stack_fffffffffffffa40;
  undefined8 in_stack_fffffffffffffa48;
  undefined8 in_stack_fffffffffffffa50;
  undefined8 in_stack_fffffffffffffa58;
  undefined8 in_stack_fffffffffffffa60;
  pointer in_stack_fffffffffffffa68;
  char *local_588;
  char *local_580;
  bool expected;
  undefined3 uStack_573;
  bool found;
  undefined7 uStack_56f;
  char *local_568;
  char *local_560;
  undefined1 *local_558;
  undefined1 *local_550;
  char *local_548;
  char *local_540;
  shared_ptr<wallet::CWallet> wallet;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock2;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock1;
  UniValue local_508;
  uint256 local_4b0;
  UniValue local_490;
  _Rb_tree<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>,_std::_Select1st<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
  local_438;
  undefined1 local_408 [184];
  UniValue local_350;
  UniValue local_2f8;
  JSONRPCRequest request;
  uint256 local_148;
  _Rb_tree<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>,_std::_Select1st<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
  local_128;
  WalletContext context;
  path local_80;
  string backup_file;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  val = &(this->super_TestChain100Setup).super_TestingSetup.super_ChainTestingSetup.
         super_BasicTestingSetup.m_node.chainman;
  inline_assertion_check<true,std::unique_ptr<ChainstateManager,std::default_delete<ChainstateManager>>&>
            (val,
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/wallet_tests.cpp"
             ,0x10b,"test_method","m_node.chainman");
  inline_assertion_check<true,std::unique_ptr<ChainstateManager,std::default_delete<ChainstateManager>>&>
            (val,
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/wallet_tests.cpp"
             ,0x10b,"operator()","m_node.chainman");
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)&request,&cs_main,
             "inline_assertion_check<true>(m_node.chainman, \"/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/wallet_tests.cpp\", 267, __func__, \"m_node.chainman\")->GetMutex()"
             ,
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/wallet_tests.cpp"
             ,0x10b,false);
  pCVar6 = ChainstateManager::ActiveChainstate
                     ((this->super_TestChain100Setup).super_TestingSetup.super_ChainTestingSetup.
                      super_BasicTestingSetup.m_node.chainman._M_t.
                      super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                      .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
  uVar10 = (ulong)(pCVar6->m_chain).vChain.
                  super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
                  super__Vector_impl_data._M_finish[-1]->nTimeMax;
  std::unique_lock<std::recursive_mutex>::~unique_lock
            ((unique_lock<std::recursive_mutex> *)&request);
  SetMockTime(uVar10 + 5);
  backup_file._M_dataplus._M_p = (pointer)0x0;
  backup_file._M_string_length = 0;
  backup_file.field_2._M_allocated_capacity = 0;
  this_00 = &(this->super_TestChain100Setup).coinbaseKey;
  CKey::GetPubKey((CPubKey *)local_408,this_00);
  GetScriptForRawPubKey((CScript *)&context,(CPubKey *)local_408);
  TestChain100Setup::CreateAndProcessBlock
            ((CBlock *)&request,&this->super_TestChain100Setup,
             (vector<CMutableTransaction,_std::allocator<CMutableTransaction>_> *)&backup_file,
             (CScript *)&context,(Chainstate *)0x0);
  this_01 = &(this->super_TestChain100Setup).m_coinbase_txns;
  std::
  vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>::
  emplace_back<std::shared_ptr<CTransaction_const>&>
            ((vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>
              *)this_01,
             (shared_ptr<const_CTransaction> *)
             request.id.super__Optional_base<UniValue,_false,_false>._M_payload.
             super__Optional_payload<UniValue,_true,_false,_false>.
             super__Optional_payload_base<UniValue>._M_payload._M_value.values.
             super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data
             ._M_end_of_storage);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             *)&request.id.super__Optional_base<UniValue,_false,_false>._M_payload.
                super__Optional_payload<UniValue,_true,_false,_false>.
                super__Optional_payload_base<UniValue>._M_payload._M_value.values.
                super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&context);
  std::vector<CMutableTransaction,_std::allocator<CMutableTransaction>_>::~vector
            ((vector<CMutableTransaction,_std::allocator<CMutableTransaction>_> *)&backup_file);
  backup_file._M_dataplus._M_p = (pointer)0x0;
  backup_file._M_string_length = 0;
  backup_file.field_2._M_allocated_capacity = 0;
  CKey::GetPubKey((CPubKey *)local_408,this_00);
  GetScriptForRawPubKey((CScript *)&context,(CPubKey *)local_408);
  TestChain100Setup::CreateAndProcessBlock
            ((CBlock *)&request,&this->super_TestChain100Setup,
             (vector<CMutableTransaction,_std::allocator<CMutableTransaction>_> *)&backup_file,
             (CScript *)&context,(Chainstate *)0x0);
  std::
  vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>::
  emplace_back<std::shared_ptr<CTransaction_const>&>
            ((vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>
              *)this_01,
             (shared_ptr<const_CTransaction> *)
             request.id.super__Optional_base<UniValue,_false,_false>._M_payload.
             super__Optional_payload<UniValue,_true,_false,_false>.
             super__Optional_payload_base<UniValue>._M_payload._M_value.values.
             super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data
             ._M_end_of_storage);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             *)&request.id.super__Optional_base<UniValue,_false,_false>._M_payload.
                super__Optional_payload<UniValue,_true,_false,_false>.
                super__Optional_payload_base<UniValue>._M_payload._M_value.values.
                super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&context);
  std::vector<CMutableTransaction,_std::allocator<CMutableTransaction>_>::~vector
            ((vector<CMutableTransaction,_std::allocator<CMutableTransaction>_> *)&backup_file);
  lVar14 = uVar10 + 0x1c25;
  SetMockTime(lVar14);
  backup_file._M_dataplus._M_p = (pointer)0x0;
  backup_file._M_string_length = 0;
  backup_file.field_2._M_allocated_capacity = 0;
  CKey::GetPubKey((CPubKey *)local_408,this_00);
  GetScriptForRawPubKey((CScript *)&context,(CPubKey *)local_408);
  TestChain100Setup::CreateAndProcessBlock
            ((CBlock *)&request,&this->super_TestChain100Setup,
             (vector<CMutableTransaction,_std::allocator<CMutableTransaction>_> *)&backup_file,
             (CScript *)&context,(Chainstate *)0x0);
  std::
  vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>::
  emplace_back<std::shared_ptr<CTransaction_const>&>
            ((vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>
              *)this_01,
             (shared_ptr<const_CTransaction> *)
             request.id.super__Optional_base<UniValue,_false,_false>._M_payload.
             super__Optional_payload<UniValue,_true,_false,_false>.
             super__Optional_payload_base<UniValue>._M_payload._M_value.values.
             super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data
             ._M_end_of_storage);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             *)&request.id.super__Optional_base<UniValue,_false,_false>._M_payload.
                super__Optional_payload<UniValue,_true,_false,_false>.
                super__Optional_payload_base<UniValue>._M_payload._M_value.values.
                super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&context);
  std::vector<CMutableTransaction,_std::allocator<CMutableTransaction>_>::~vector
            ((vector<CMutableTransaction,_std::allocator<CMutableTransaction>_> *)&backup_file);
  this_02 = &(this->super_TestChain100Setup).super_TestingSetup.super_ChainTestingSetup.
             super_BasicTestingSetup.m_args;
  pTVar15 = &this->super_TestChain100Setup;
  ArgsManager::GetDataDirNet((path *)&local_80,this_02);
  fs::path::operator/=((path *)&local_80,"wallet.backup");
  std::filesystem::__cxx11::path::path((path *)&request,&local_80);
  std::filesystem::__cxx11::path::string(&backup_file,(path *)&request);
  std::filesystem::__cxx11::path::~path((path *)&request);
  std::filesystem::__cxx11::path::~path(&local_80);
  WalletContext::WalletContext(&context);
  request.id.super__Optional_base<UniValue,_false,_false>._M_payload.
  super__Optional_payload<UniValue,_true,_false,_false>.super__Optional_payload_base<UniValue>.
  _M_payload._0_8_ =
       (this->super_TestChain100Setup).super_TestingSetup.super_ChainTestingSetup.
       super_BasicTestingSetup.m_node.chain._M_t.
       super___uniq_ptr_impl<interfaces::Chain,_std::default_delete<interfaces::Chain>_>._M_t.
       super__Tuple_impl<0UL,_interfaces::Chain_*,_std::default_delete<interfaces::Chain>_>.
       super__Head_base<0UL,_interfaces::Chain_*,_false>._M_head_impl;
  local_128._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_128._M_impl.super__Rb_tree_header._M_header;
  local_128._M_impl._0_8_ = 0;
  local_128._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_128._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_128._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_128._M_impl.super__Rb_tree_header._M_node_count = 0;
  records._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = pTVar15;
  records._M_t._M_impl._0_8_ = in_stack_fffffffffffffa18;
  records._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)in_stack_fffffffffffffa28;
  records._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       (_Base_ptr)in_stack_fffffffffffffa30;
  records._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       (_Base_ptr)in_stack_fffffffffffffa38;
  records._M_t._M_impl.super__Rb_tree_header._M_node_count = in_stack_fffffffffffffa40;
  local_128._M_impl.super__Rb_tree_header._M_header._M_right =
       local_128._M_impl.super__Rb_tree_header._M_header._M_left;
  context.args = this_02;
  CreateMockableWalletDatabase(records);
  std::
  make_shared<wallet::CWallet,interfaces::Chain*,char_const(&)[1],std::unique_ptr<wallet::WalletDatabase,std::default_delete<wallet::WalletDatabase>>>
            ((Chain **)&wallet,(char (*) [1])&request,
             (unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_> *)
             0xc7f1cc);
  if ((WalletContext *)local_408._0_8_ != (WalletContext *)0x0) {
    (**(code **)(*(long *)local_408._0_8_ + 8))();
  }
  local_408._0_8_ = (WalletContext *)0x0;
  std::
  _Rb_tree<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>,_std::_Select1st<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
  ::~_Rb_tree(&local_128);
  pLVar7 = CWallet::GetOrCreateLegacyScriptPubKeyMan
                     (wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
  ;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock1,
             &(wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              cs_wallet,"wallet->cs_wallet",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/wallet_tests.cpp"
             ,0x11f,false);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock2,
             &(pLVar7->super_LegacyDataSPKM).super_FillableSigningProvider.cs_KeyStore,
             "spk_man->cs_KeyStore",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/wallet_tests.cpp"
             ,0x11f,false);
  CKey::GetPubKey((CPubKey *)&request,this_00);
  CPubKey::GetID((CKeyID *)local_408,(CPubKey *)&request);
  pmVar8 = std::
           map<CKeyID,_wallet::CKeyMetadata,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_wallet::CKeyMetadata>_>_>
           ::operator[](&(pLVar7->super_LegacyDataSPKM).mapKeyMetadata,(key_type *)local_408);
  pmVar8->nCreateTime = lVar14;
  CKey::GetPubKey((CPubKey *)&request,this_00);
  (*(pLVar7->super_LegacyDataSPKM).super_ScriptPubKeyMan._vptr_ScriptPubKeyMan[0x23])
            (pLVar7,this_00,&request);
  AddWallet(&context,&wallet);
  inline_assertion_check<true,std::unique_ptr<ChainstateManager,std::default_delete<ChainstateManager>>&>
            (val,
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/wallet_tests.cpp"
             ,0x124,"test_method","m_node.chainman");
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)&request,&cs_main,
             "Assert(m_node.chainman)->GetMutex()",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/wallet_tests.cpp"
             ,0x124,false);
  peVar5 = wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  pCVar6 = ChainstateManager::ActiveChainstate
                     ((val->_M_t).
                      super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                      .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
  ppCVar2 = (pCVar6->m_chain).vChain.
            super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppCVar3 = (pCVar6->m_chain).vChain.
            super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  pCVar6 = ChainstateManager::ActiveChainstate
                     ((val->_M_t).
                      super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                      .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
  CBlockIndex::GetBlockHash
            (&local_148,
             (pCVar6->m_chain).vChain.
             super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
             super__Vector_impl_data._M_finish[-1]);
  peVar5->m_last_block_processed_height = (int)((ulong)((long)ppCVar3 - (long)ppCVar2) >> 3) + -1;
  *(undefined8 *)(peVar5->m_last_block_processed).super_base_blob<256U>.m_data._M_elems =
       local_148.super_base_blob<256U>.m_data._M_elems._0_8_;
  *(undefined8 *)((peVar5->m_last_block_processed).super_base_blob<256U>.m_data._M_elems + 8) =
       local_148.super_base_blob<256U>.m_data._M_elems._8_8_;
  *(undefined8 *)((peVar5->m_last_block_processed).super_base_blob<256U>.m_data._M_elems + 0x10) =
       local_148.super_base_blob<256U>.m_data._M_elems._16_8_;
  *(undefined8 *)((peVar5->m_last_block_processed).super_base_blob<256U>.m_data._M_elems + 0x18) =
       local_148.super_base_blob<256U>.m_data._M_elems._24_8_;
  std::unique_lock<std::recursive_mutex>::~unique_lock
            ((unique_lock<std::recursive_mutex> *)&request);
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock2.super_unique_lock);
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock1.super_unique_lock);
  JSONRPCRequest::JSONRPCRequest(&request);
  local_408._0_8_ = &context;
  std::any::operator=(&request.context,(WalletContext **)local_408);
  pTVar16 = pTVar15;
  UniValue::setArray(&request.params);
  UniValue::
  UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (&local_2f8,&backup_file);
  val_00.val._M_dataplus._M_p = (pointer)pTVar16;
  val_00._0_8_ = in_stack_fffffffffffffa18;
  val_00.val._M_string_length = in_stack_fffffffffffffa28;
  val_00.val.field_2._M_allocated_capacity = in_stack_fffffffffffffa30;
  val_00.val.field_2._8_8_ = in_stack_fffffffffffffa38;
  val_00.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffffa40;
  val_00.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffffa48;
  val_00.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffffa50;
  val_00.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffffa58;
  val_00.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffffa60;
  val_00.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = in_stack_fffffffffffffa68;
  UniValue::push_back(&request.params,val_00);
  UniValue::~UniValue(&local_2f8);
  dumpwallet();
  RPCHelpMan::HandleRequest(&local_350,(RPCHelpMan *)local_408,&request);
  UniValue::~UniValue(&local_350);
  RPCHelpMan::~RPCHelpMan((RPCHelpMan *)local_408);
  RemoveWallet(&context,&wallet,(optional<bool>)0x0);
  JSONRPCRequest::~JSONRPCRequest(&request);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  WalletContext::~WalletContext(&context);
  request.id.super__Optional_base<UniValue,_false,_false>._M_payload.
  super__Optional_payload<UniValue,_true,_false,_false>.super__Optional_payload_base<UniValue>.
  _M_payload._0_8_ =
       (pTVar15->super_TestingSetup).super_ChainTestingSetup.super_BasicTestingSetup.m_node.chain.
       _M_t.super___uniq_ptr_impl<interfaces::Chain,_std::default_delete<interfaces::Chain>_>._M_t.
       super__Tuple_impl<0UL,_interfaces::Chain_*,_std::default_delete<interfaces::Chain>_>.
       super__Head_base<0UL,_interfaces::Chain_*,_false>._M_head_impl;
  local_438._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_438._M_impl.super__Rb_tree_header._M_header;
  local_438._M_impl._0_8_ = 0;
  local_438._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_438._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_438._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_438._M_impl.super__Rb_tree_header._M_node_count = 0;
  records_00._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = pTVar16;
  records_00._M_t._M_impl._0_8_ = in_stack_fffffffffffffa18;
  records_00._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)in_stack_fffffffffffffa28;
  records_00._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       (_Base_ptr)in_stack_fffffffffffffa30;
  records_00._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       (_Base_ptr)in_stack_fffffffffffffa38;
  records_00._M_t._M_impl.super__Rb_tree_header._M_node_count = in_stack_fffffffffffffa40;
  local_438._M_impl.super__Rb_tree_header._M_header._M_right =
       local_438._M_impl.super__Rb_tree_header._M_header._M_left;
  CreateMockableWalletDatabase(records_00);
  std::
  make_shared<wallet::CWallet,interfaces::Chain*,char_const(&)[1],std::unique_ptr<wallet::WalletDatabase,std::default_delete<wallet::WalletDatabase>>>
            ((Chain **)&wallet,(char (*) [1])&request,
             (unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_> *)
             0xc7f1cc);
  if ((WalletContext *)local_408._0_8_ != (WalletContext *)0x0) {
    (**(code **)(*(long *)local_408._0_8_ + 8))();
  }
  local_408._0_8_ = (WalletContext *)0x0;
  std::
  _Rb_tree<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>,_std::_Select1st<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
  ::~_Rb_tree(&local_438);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock1,
             &(wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              cs_wallet,"wallet->cs_wallet",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/wallet_tests.cpp"
             ,0x134,false);
  CWallet::SetupLegacyScriptPubKeyMan
            (wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  WalletContext::WalletContext(&context);
  context.args = this_02;
  JSONRPCRequest::JSONRPCRequest(&request);
  local_408._0_8_ = &context;
  std::any::operator=(&request.context,(WalletContext **)local_408);
  UniValue::setArray(&request.params);
  UniValue::
  UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (&local_490,&backup_file);
  val_01.val._M_dataplus._M_p = (pointer)pTVar16;
  val_01._0_8_ = in_stack_fffffffffffffa18;
  val_01.val._M_string_length = in_stack_fffffffffffffa28;
  val_01.val.field_2._M_allocated_capacity = in_stack_fffffffffffffa30;
  val_01.val.field_2._8_8_ = in_stack_fffffffffffffa38;
  val_01.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffffa40;
  val_01.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffffa48;
  val_01.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffffa50;
  val_01.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffffa58;
  val_01.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffffa60;
  val_01.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = in_stack_fffffffffffffa68;
  UniValue::push_back(&request.params,val_01);
  UniValue::~UniValue(&local_490);
  AddWallet(&context,&wallet);
  inline_assertion_check<true,std::unique_ptr<ChainstateManager,std::default_delete<ChainstateManager>>&>
            (val,
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/wallet_tests.cpp"
             ,0x13e,"test_method","m_node.chainman");
  pvVar11 = (iterator)0x13e;
  pvVar12 = (iterator)0x0;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock2,&cs_main,"Assert(m_node.chainman)->GetMutex()",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/wallet_tests.cpp"
             ,0x13e,false);
  peVar5 = wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  pCVar6 = ChainstateManager::ActiveChainstate
                     ((val->_M_t).
                      super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                      .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
  ppCVar2 = (pCVar6->m_chain).vChain.
            super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppCVar3 = (pCVar6->m_chain).vChain.
            super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  pCVar6 = ChainstateManager::ActiveChainstate
                     ((val->_M_t).
                      super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                      .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
  CBlockIndex::GetBlockHash
            (&local_4b0,
             (pCVar6->m_chain).vChain.
             super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
             super__Vector_impl_data._M_finish[-1]);
  peVar5->m_last_block_processed_height = (int)((ulong)((long)ppCVar3 - (long)ppCVar2) >> 3) + -1;
  *(undefined8 *)(peVar5->m_last_block_processed).super_base_blob<256U>.m_data._M_elems =
       local_4b0.super_base_blob<256U>.m_data._M_elems._0_8_;
  *(undefined8 *)((peVar5->m_last_block_processed).super_base_blob<256U>.m_data._M_elems + 8) =
       local_4b0.super_base_blob<256U>.m_data._M_elems._8_8_;
  *(undefined8 *)((peVar5->m_last_block_processed).super_base_blob<256U>.m_data._M_elems + 0x10) =
       local_4b0.super_base_blob<256U>.m_data._M_elems._16_8_;
  *(undefined8 *)((peVar5->m_last_block_processed).super_base_blob<256U>.m_data._M_elems + 0x18) =
       local_4b0.super_base_blob<256U>.m_data._M_elems._24_8_;
  importwallet();
  RPCHelpMan::HandleRequest(&local_508,(RPCHelpMan *)local_408,&request);
  UniValue::~UniValue(&local_508);
  RPCHelpMan::~RPCHelpMan((RPCHelpMan *)local_408);
  RemoveWallet(&context,&wallet,(optional<bool>)0x0);
  local_548 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/wallet_tests.cpp"
  ;
  local_540 = "";
  local_558 = &boost::unit_test::basic_cstring<char_const>::null;
  local_550 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x143;
  file.m_begin = (iterator)&local_548;
  msg.m_end = pvVar12;
  msg.m_begin = pvVar11;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_558,msg);
  local_408[8] = '\0';
  local_408._0_8_ = &PTR__lazy_ostream_011480b0;
  local_408._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_408._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_568 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/wallet_tests.cpp"
  ;
  local_560 = "";
  _found = ((wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
           mapWallet)._M_h._M_element_count;
  pbVar13 = &found;
  _expected = 3;
  pvVar11 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
            (local_408,&local_568,0x143,1,2,pbVar13,"wallet->mapWallet.size()",&expected,"3U");
  local_588 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/wallet_tests.cpp"
  ;
  local_580 = "";
  file_00.m_end = (iterator)0x144;
  file_00.m_begin = (iterator)&local_588;
  msg_00.m_end = pbVar13;
  msg_00.m_begin = pvVar11;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,
             (size_t)&stack0xfffffffffffffa68,msg_00);
  local_408[8] = '\0';
  local_408._0_8_ = &PTR__lazy_ostream_011480b0;
  local_408._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_408._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  _found = (long)(pTVar15->m_coinbase_txns).
                 super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(pTVar15->m_coinbase_txns).
                 super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 4;
  pbVar13 = &found;
  _expected = 0x67;
  pvVar11 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
            (local_408,&stack0xfffffffffffffa58,0x144,1,2,pbVar13,"m_coinbase_txns.size()",&expected
             ,"103U");
  lVar14 = 0;
  for (uVar10 = 0;
      psVar4 = (pTVar16->m_coinbase_txns).
               super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
      uVar10 < (ulong)((long)(pTVar16->m_coinbase_txns).
                             super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)psVar4 >> 4);
      uVar10 = uVar10 + 1) {
    pCVar9 = CWallet::GetWalletTx
                       (wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr,(uint256 *)
                               (*(long *)((long)&(psVar4->
                                                 super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                                 )._M_ptr + lVar14) + 0x39));
    _found = CONCAT71(uStack_56f,pCVar9 != (CWalletTx *)0x0);
    _expected = CONCAT31(uStack_573,99 < uVar10);
    file_01.m_end = (iterator)0x148;
    file_01.m_begin = &stack0xfffffffffffffa48;
    msg_01.m_end = pbVar13;
    msg_01.m_begin = pvVar11;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,
               (size_t)&stack0xfffffffffffffa38,msg_01);
    local_408[8] = '\0';
    local_408._0_8_ = &PTR__lazy_ostream_011480b0;
    local_408._16_8_ = boost::unit_test::lazy_ostream::inst;
    local_408._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
    pvVar11 = (iterator)0x2;
    pbVar13 = &found;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
              (local_408,&stack0xfffffffffffffa28,0x148,1,2,&found,"found",&expected,"expected");
    lVar14 = lVar14 + 0x10;
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock2.super_unique_lock);
  JSONRPCRequest::~JSONRPCRequest(&request);
  WalletContext::~WalletContext(&context);
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock1.super_unique_lock);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__cxx11::string::~string((string *)&backup_file);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_FIXTURE_TEST_CASE(importwallet_rescan, TestChain100Setup)
{
    // Create two blocks with same timestamp to verify that importwallet rescan
    // will pick up both blocks, not just the first.
    const int64_t BLOCK_TIME = WITH_LOCK(Assert(m_node.chainman)->GetMutex(), return m_node.chainman->ActiveChain().Tip()->GetBlockTimeMax() + 5);
    SetMockTime(BLOCK_TIME);
    m_coinbase_txns.emplace_back(CreateAndProcessBlock({}, GetScriptForRawPubKey(coinbaseKey.GetPubKey())).vtx[0]);
    m_coinbase_txns.emplace_back(CreateAndProcessBlock({}, GetScriptForRawPubKey(coinbaseKey.GetPubKey())).vtx[0]);

    // Set key birthday to block time increased by the timestamp window, so
    // rescan will start at the block time.
    const int64_t KEY_TIME = BLOCK_TIME + TIMESTAMP_WINDOW;
    SetMockTime(KEY_TIME);
    m_coinbase_txns.emplace_back(CreateAndProcessBlock({}, GetScriptForRawPubKey(coinbaseKey.GetPubKey())).vtx[0]);

    std::string backup_file = fs::PathToString(m_args.GetDataDirNet() / "wallet.backup");

    // Import key into wallet and call dumpwallet to create backup file.
    {
        WalletContext context;
        context.args = &m_args;
        const std::shared_ptr<CWallet> wallet = std::make_shared<CWallet>(m_node.chain.get(), "", CreateMockableWalletDatabase());
        {
            auto spk_man = wallet->GetOrCreateLegacyScriptPubKeyMan();
            LOCK2(wallet->cs_wallet, spk_man->cs_KeyStore);
            spk_man->mapKeyMetadata[coinbaseKey.GetPubKey().GetID()].nCreateTime = KEY_TIME;
            spk_man->AddKeyPubKey(coinbaseKey, coinbaseKey.GetPubKey());

            AddWallet(context, wallet);
            LOCK(Assert(m_node.chainman)->GetMutex());
            wallet->SetLastBlockProcessed(m_node.chainman->ActiveChain().Height(), m_node.chainman->ActiveChain().Tip()->GetBlockHash());
        }
        JSONRPCRequest request;
        request.context = &context;
        request.params.setArray();
        request.params.push_back(backup_file);

        wallet::dumpwallet().HandleRequest(request);
        RemoveWallet(context, wallet, /* load_on_start= */ std::nullopt);
    }

    // Call importwallet RPC and verify all blocks with timestamps >= BLOCK_TIME
    // were scanned, and no prior blocks were scanned.
    {
        const std::shared_ptr<CWallet> wallet = std::make_shared<CWallet>(m_node.chain.get(), "", CreateMockableWalletDatabase());
        LOCK(wallet->cs_wallet);
        wallet->SetupLegacyScriptPubKeyMan();

        WalletContext context;
        context.args = &m_args;
        JSONRPCRequest request;
        request.context = &context;
        request.params.setArray();
        request.params.push_back(backup_file);
        AddWallet(context, wallet);
        LOCK(Assert(m_node.chainman)->GetMutex());
        wallet->SetLastBlockProcessed(m_node.chainman->ActiveChain().Height(), m_node.chainman->ActiveChain().Tip()->GetBlockHash());
        wallet::importwallet().HandleRequest(request);
        RemoveWallet(context, wallet, /* load_on_start= */ std::nullopt);

        BOOST_CHECK_EQUAL(wallet->mapWallet.size(), 3U);
        BOOST_CHECK_EQUAL(m_coinbase_txns.size(), 103U);
        for (size_t i = 0; i < m_coinbase_txns.size(); ++i) {
            bool found = wallet->GetWalletTx(m_coinbase_txns[i]->GetHash());
            bool expected = i >= 100;
            BOOST_CHECK_EQUAL(found, expected);
        }
    }
}